

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb_fastpforlib::internal::__fastpack28(uint64_t *in,uint32_t *out)

{
  uint64_t *in_RSI;
  uint32_t *in_stack_ffffffffffffffe8;
  
  Unroller<(unsigned_short)28,_(unsigned_short)0>::Pack(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void __fastpack28(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<28>::Pack(in, out);
}